

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void __thiscall
andres::View<float,_false,_std::allocator<unsigned_long>_>::indexToOffset
          (View<float,_false,_std::allocator<unsigned_long>_> *this,size_t index,size_t *out)

{
  pointer pfVar1;
  size_t *psVar2;
  size_t *psVar3;
  runtime_error *this_00;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  testInvariant(this);
  if (index < (this->geometry_).size_) {
    testInvariant(this);
    if ((this->geometry_).isSimple_ == true) {
      *out = index;
      return;
    }
    *out = 0;
    testInvariant(this);
    pfVar1 = this->data_;
    if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
      if (pfVar1 != (pointer)0x0) {
        sVar5 = *out;
        psVar2 = (this->geometry_).shapeStrides_;
        psVar3 = (this->geometry_).strides_;
        uVar4 = 0;
        do {
          if ((this->geometry_).dimension_ <= uVar4) {
            return;
          }
          if ((this->geometry_).dimension_ <= uVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_001e8663;
          }
          sVar5 = sVar5 + (index / psVar2[uVar4]) * psVar3[uVar4];
          *out = sVar5;
          if ((this->geometry_).dimension_ <= uVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Assertion failed.");
            goto LAB_001e8663;
          }
          index = index % psVar2[uVar4];
          uVar4 = uVar4 + 1;
        } while (pfVar1 != (pointer)0x0);
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else if (pfVar1 == (pointer)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
    }
    else {
      sVar5 = (this->geometry_).dimension_;
      if (sVar5 == 0) {
        if (index == 0) {
          return;
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
      else {
        uVar4 = sVar5 - 1;
        if (uVar4 < (this->geometry_).dimension_) {
          psVar2 = (this->geometry_).shapeStrides_;
          psVar3 = (this->geometry_).strides_;
          do {
            *out = *out + (index / psVar2[uVar4]) * psVar3[uVar4];
            if ((this->geometry_).dimension_ <= uVar4) {
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,"Assertion failed.");
              goto LAB_001e8663;
            }
            uVar6 = uVar4 - 1;
            if (uVar4 == 0) {
              return;
            }
            index = index % psVar2[uVar4];
            uVar4 = uVar6;
          } while (uVar6 < (this->geometry_).dimension_);
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Assertion failed.");
      }
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
  }
LAB_001e8663:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
View<T, isConst, A>::indexToOffset
(
    std::size_t index,
    std::size_t& out
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size()); 
    if(isSimple()) {
        out = index;
    }
    else {
        out = 0;
        if(coordinateOrder() == FirstMajorOrder) {
            for(std::size_t j=0; j<this->dimension(); ++j) {
                out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                index = index % geometry_.shapeStrides(j);
            }
        }
        else { // last major order
            if(this->dimension() == 0) {
                marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
                return;
            }
            else {
                std::size_t j = this->dimension()-1;
                for(;;) {
                    out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                    index = index % geometry_.shapeStrides(j);
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
}